

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
cmInstallCommand::HandleExportMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCommandArgumentGroup *group;
  pointer pbVar1;
  cmTargetExport *pcVar2;
  char *destination;
  char *file_permissions;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  MessageLevel message;
  ostream *poVar6;
  string *psVar7;
  long lVar8;
  cmGlobalGenerator *pcVar9;
  cmExportSet *exportSet;
  cmInstallExportGenerator *this_00;
  cmInstallCommandArguments *pcVar10;
  string *psVar11;
  cmInstallCommandArguments *pcVar12;
  pointer ppcVar13;
  string fname;
  string local_7a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_750 [6];
  ios_base local_6f0 [264];
  cmCAString exp;
  cmCAString filename;
  cmCAEnabler exportOld;
  cmCAString name_space;
  cmInstallCommandArguments ica;
  
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&this->DefaultComponentName);
  cmCAString::cmCAString(&exp,&ica.Parser,"EXPORT",(cmCommandArgumentGroup *)0x0);
  group = &ica.ArgumentGroup;
  cmCAString::cmCAString(&name_space,&ica.Parser,"NAMESPACE",group);
  cmCAEnabler::cmCAEnabler(&exportOld,&ica.Parser,"EXPORT_LINK_INTERFACE_LIBRARIES",group);
  cmCAString::cmCAString(&filename,&ica.Parser,"FILE",group);
  cmCommandArgument::Follows(&exp.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(group,&exp.super_cmCommandArgument);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&ica.Parser,args,&unknownArgs);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar12 = &ica;
    bVar3 = cmInstallCommandArguments::Finalize(pcVar12);
    if (bVar3) {
      psVar7 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
      do {
        if ((pcVar12->DestinationString)._M_string_length != 0) {
          psVar7 = &pcVar12->DestinationString;
          break;
        }
        pcVar12 = pcVar12->GenericArguments;
      } while (pcVar12 != (cmInstallCommandArguments *)0x0);
      if (psVar7->_M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," given no DESTINATION!",0x16);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&fname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fname._M_dataplus._M_p != &fname.field_2) {
          operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00273a17;
      }
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fname,filename.String._M_dataplus._M_p,
                 filename.String._M_dataplus._M_p + filename.String._M_string_length);
      lVar8 = std::__cxx11::string::find_first_of((char *)&fname,0x4ee18a,0);
      if (lVar8 == -1) {
        if (fname._M_string_length != 0) {
          cmsys::SystemTools::GetFilenameLastExtension((string *)&e,&fname);
          iVar4 = std::__cxx11::string::compare((char *)&e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_e != local_750) {
            operator_delete(_e,local_750[0]._M_allocated_capacity + 1);
          }
          if (iVar4 == 0) {
            if (fname._M_string_length == 0) goto LAB_00273e30;
            goto LAB_00273f4b;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," given invalid export file name \"",0x21);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,fname._M_dataplus._M_p,fname._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"The FILE argument must specify a name ending in \".cmake\".",0x39);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_7a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
            operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00273c78;
        }
LAB_00273e30:
        std::__cxx11::string::_M_assign((string *)&fname);
        std::__cxx11::string::append((char *)&fname);
        lVar8 = std::__cxx11::string::find_first_of((char *)&fname,0x4ee18a,0);
        if (lVar8 != -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," given export name \"",0x14);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,exp.String._M_dataplus._M_p,exp.String._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"This name cannot be safely converted to a file name.  ",0x36);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"Specify a different export name or use the FILE option to set ",0x3e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"a file name explicitly.",0x17);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_7a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
            operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00273c78;
        }
LAB_00273f4b:
        pcVar9 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        exportSet = cmExportSetMap::operator[](&pcVar9->ExportSets,&exp.String);
        if ((exportOld.Enabled == true) &&
           (ppcVar13 = (exportSet->TargetExports).
                       super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,
           ppcVar13 !=
           (exportSet->TargetExports).
           super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
           super__Vector_impl_data._M_finish)) {
          do {
            pcVar2 = *ppcVar13;
            PVar5 = cmPolicies::PolicyMap::Get(&pcVar2->Target->PolicyMap,CMP0022);
            if ((PVar5 == WARN) ||
               (PVar5 = cmPolicies::PolicyMap::Get(&pcVar2->Target->PolicyMap,CMP0022), PVar5 == OLD
               )) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"INSTALL(EXPORT) given keyword \"",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"EXPORT_LINK_INTERFACE_LIBRARIES",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"\", but target \"",0xf);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&e,(pcVar2->Target->Name)._M_dataplus._M_p,
                                  (pcVar2->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,"\" does not have policy CMP0022 set to NEW.",0x2a);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_7a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
                operator_delete(local_7a8._M_dataplus._M_p,
                                local_7a8.field_2._M_allocated_capacity + 1);
              }
              goto LAB_00273c78;
            }
            ppcVar13 = ppcVar13 + 1;
          } while (ppcVar13 !=
                   (exportSet->TargetExports).
                   super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
        this_00 = (cmInstallExportGenerator *)operator_new(0x178);
        pcVar12 = &ica;
        psVar7 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
        do {
          if ((pcVar12->DestinationString)._M_string_length != 0) {
            psVar11 = &pcVar12->DestinationString;
            goto LAB_00274016;
          }
          pcVar12 = pcVar12->GenericArguments;
        } while (pcVar12 != (cmInstallCommandArguments *)0x0);
        psVar11 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
LAB_00274016:
        destination = (psVar11->_M_dataplus)._M_p;
        pcVar12 = &ica;
        do {
          if ((pcVar12->PermissionsString)._M_string_length != 0) {
            psVar7 = &pcVar12->PermissionsString;
            break;
          }
          pcVar12 = pcVar12->GenericArguments;
        } while (pcVar12 != (cmInstallCommandArguments *)0x0);
        file_permissions = (psVar7->_M_dataplus)._M_p;
        pcVar12 = &ica;
        do {
          pcVar10 = pcVar12;
          if ((pcVar10->Configurations).Vector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pcVar10->Configurations).Vector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) break;
          pcVar12 = pcVar10->GenericArguments;
        } while (pcVar10->GenericArguments != (cmInstallCommandArguments *)0x0);
        psVar7 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        cmInstallExportGenerator::cmInstallExportGenerator
                  (this_00,exportSet,destination,file_permissions,&(pcVar10->Configurations).Vector,
                   (psVar7->_M_dataplus)._M_p,message,fname._M_dataplus._M_p,
                   name_space.String._M_dataplus._M_p,exportOld.Enabled,
                   (this->super_cmCommand).Makefile);
        bVar3 = true;
        cmMakefile::AddInstallGenerator
                  ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_00);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," given invalid export file name \"",0x21);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,fname._M_dataplus._M_p,fname._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".  ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"The FILE argument may not contain a path.  ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"Specify the path in the DESTINATION argument.",0x2d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_7a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
LAB_00273c78:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_6f0);
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00273a73;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," given unknown argument \"",0x19);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,((unknownArgs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (unknownArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&fname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fname._M_dataplus._M_p != &fname.field_2) {
      operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
    }
LAB_00273a17:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_6f0);
  }
  bVar3 = false;
LAB_00273a73:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  filename.super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005fa800
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename.String._M_dataplus._M_p != &filename.String.field_2) {
    operator_delete(filename.String._M_dataplus._M_p,
                    filename.String.field_2._M_allocated_capacity + 1);
  }
  filename.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005f7cd8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&filename.super_cmCommandArgument.ArgumentsBefore._M_t);
  exportOld.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005f7cd8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&exportOld.super_cmCommandArgument.ArgumentsBefore._M_t);
  name_space.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_005fa800;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_space.String._M_dataplus._M_p != &name_space.String.field_2) {
    operator_delete(name_space.String._M_dataplus._M_p,
                    name_space.String.field_2._M_allocated_capacity + 1);
  }
  name_space.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005f7cd8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&name_space.super_cmCommandArgument.ArgumentsBefore._M_t);
  exp.super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005fa800;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp.String._M_dataplus._M_p != &exp.String.field_2) {
    operator_delete(exp.String._M_dataplus._M_p,exp.String.field_2._M_allocated_capacity + 1);
  }
  exp.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005f7cd8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&exp.super_cmCommandArgument.ArgumentsBefore._M_t);
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  return bVar3;
}

Assistant:

bool cmInstallCommand::HandleExportMode(std::vector<std::string> const& args)
{
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAString exp(&ica.Parser, "EXPORT");
  cmCAString name_space(&ica.Parser, "NAMESPACE", &ica.ArgumentGroup);
  cmCAEnabler exportOld(&ica.Parser, "EXPORT_LINK_INTERFACE_LIBRARIES",
                        &ica.ArgumentGroup);
  cmCAString filename(&ica.Parser, "FILE", &ica.ArgumentGroup);
  exp.Follows(0);

  ica.ArgumentGroup.Follows(&exp);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty())
    {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
    }

  if (!ica.Finalize())
    {
    return false;
    }

  // Make sure there is a destination.
  if(ica.GetDestination().empty())
    {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
    }

  // Check the file name.
  std::string fname = filename.GetString();
  if(fname.find_first_of(":/\\") != fname.npos)
    {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
    }

  // Check the file extension.
  if(!fname.empty() &&
     cmSystemTools::GetFilenameLastExtension(fname) != ".cmake")
    {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".cmake\".";
    this->SetError(e.str());
    return false;
    }

  // Construct the file name.
  if(fname.empty())
    {
    fname = exp.GetString();
    fname += ".cmake";

    if(fname.find_first_of(":/\\") != fname.npos)
      {
      std::ostringstream e;
      e << args[0] << " given export name \"" << exp.GetString() << "\".  "
        << "This name cannot be safely converted to a file name.  "
        << "Specify a different export name or use the FILE option to set "
        << "a file name explicitly.";
      this->SetError(e.str());
      return false;
      }
    }

  cmExportSet *exportSet = this->Makefile->GetGlobalGenerator()
                                         ->GetExportSets()[exp.GetString()];
  if (exportOld.IsEnabled())
    {
    for(std::vector<cmTargetExport*>::const_iterator
          tei = exportSet->GetTargetExports()->begin();
        tei != exportSet->GetTargetExports()->end(); ++tei)
      {
      cmTargetExport const* te = *tei;
      const bool newCMP0022Behavior =
                      te->Target->GetPolicyStatusCMP0022() != cmPolicies::WARN
                   && te->Target->GetPolicyStatusCMP0022() != cmPolicies::OLD;

      if(!newCMP0022Behavior)
        {
        std::ostringstream e;
        e << "INSTALL(EXPORT) given keyword \""
          << "EXPORT_LINK_INTERFACE_LIBRARIES" << "\", but target \""
          << te->Target->GetName()
          << "\" does not have policy CMP0022 set to NEW.";
        this->SetError(e.str());
        return false;
        }
      }
    }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator =
    new cmInstallExportGenerator(
      exportSet,
      ica.GetDestination().c_str(),
      ica.GetPermissions().c_str(), ica.GetConfigurations(),
      ica.GetComponent().c_str(), message, fname.c_str(),
      name_space.GetCString(), exportOld.IsEnabled(), this->Makefile);
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
}